

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int gost_magma_mgm_ctrl(EVP_CIPHER_CTX *c,int type,int arg,void *ptr)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  char *file;
  EVP_CIPHER *pEVar4;
  undefined8 uVar5;
  void *pvVar6;
  undefined4 *in_RCX;
  int in_EDX;
  uint in_ESI;
  EVP_CIPHER_CTX *in_RDI;
  int enc;
  int ivlen;
  uchar *iv;
  uchar *buf;
  gost_mgm_ctx *mctx;
  int in_stack_ffffffffffffffc4;
  int local_4;
  
  lVar3 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  file = (char *)(ulong)in_ESI;
  switch(file) {
  case (char *)0x0:
    pEVar4 = EVP_CIPHER_CTX_cipher(in_RDI);
    uVar1 = EVP_CIPHER_get_iv_length(pEVar4);
    uVar5 = EVP_CIPHER_CTX_iv_noconst(in_RDI);
    *(undefined4 *)(lVar3 + 0x1088) = 0;
    *(undefined4 *)(lVar3 + 0x108c) = 0;
    *(undefined4 *)(lVar3 + 0x1160) = uVar1;
    *(undefined8 *)(lVar3 + 0x1158) = uVar5;
    *(undefined4 *)(lVar3 + 0x1164) = 0xffffffff;
    local_4 = 1;
    break;
  default:
    local_4 = -1;
    break;
  case (char *)0x9:
    if (in_EDX < 1) {
      local_4 = 0;
    }
    else if ((in_EDX < 0x11) || (in_EDX <= *(int *)(lVar3 + 0x1160))) {
      *(int *)(lVar3 + 0x1160) = in_EDX;
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
    break;
  case (char *)0x10:
    pvVar6 = (void *)EVP_CIPHER_CTX_buf_noconst(in_RDI);
    iVar2 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
    if (((in_EDX < 1) || (8 < in_EDX)) || ((iVar2 == 0 || (*(int *)(lVar3 + 0x1164) < 0)))) {
      ERR_GOST_error(in_stack_ffffffffffffffc4,iVar2,file,0);
      local_4 = 0;
    }
    else {
      memcpy(in_RCX,pvVar6,(long)in_EDX);
      local_4 = 1;
    }
    break;
  case (char *)0x11:
    pvVar6 = (void *)EVP_CIPHER_CTX_buf_noconst(in_RDI);
    iVar2 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
    if (((in_EDX < 1) || (in_EDX != 8)) || (iVar2 != 0)) {
      ERR_GOST_error(in_stack_ffffffffffffffc4,iVar2,file,0);
      local_4 = 0;
    }
    else {
      memcpy(pvVar6,in_RCX,8);
      *(undefined4 *)(lVar3 + 0x1164) = 8;
      local_4 = 1;
    }
    break;
  case (char *)0x25:
    *in_RCX = *(undefined4 *)(lVar3 + 0x1160);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int gost_magma_mgm_ctrl(EVP_CIPHER_CTX *c, int type, int arg, void *ptr)
{
    gost_mgm_ctx *mctx =
        (gost_mgm_ctx *)EVP_CIPHER_CTX_get_cipher_data(c);
    unsigned char *buf, *iv;
    int ivlen, enc;

    switch (type) {
    case EVP_CTRL_INIT:
        ivlen = EVP_CIPHER_iv_length(EVP_CIPHER_CTX_cipher(c));
        iv = EVP_CIPHER_CTX_iv_noconst(c);
        mctx->key_set = 0;
        mctx->iv_set = 0;
        mctx->ivlen = ivlen;
        mctx->iv = iv;
        mctx->taglen = -1;
        return 1;

    case EVP_CTRL_GET_IVLEN:
        *(int *)ptr = mctx->ivlen;
        return 1;

    case EVP_CTRL_AEAD_SET_IVLEN:
        if (arg <= 0)
            return 0;
        if ((arg > EVP_MAX_IV_LENGTH) && (arg > mctx->ivlen)) {
            // TODO: Allocate memory for IV or set error
            return 0;
        }
        mctx->ivlen = arg;
        return 1;

    case EVP_CTRL_AEAD_SET_TAG:
        buf = EVP_CIPHER_CTX_buf_noconst(c);
        enc = EVP_CIPHER_CTX_encrypting(c);
        if (arg <= 0 || arg != 8 || enc) {
            GOSTerr(GOST_F_GOST_MAGMA_MGM_CTRL,
                    GOST_R_INVALID_TAG_LENGTH);
            return 0;
        }
        memcpy(buf, ptr, arg);
        mctx->taglen = arg;
        return 1;

    case EVP_CTRL_AEAD_GET_TAG:
        buf = EVP_CIPHER_CTX_buf_noconst(c);
        enc = EVP_CIPHER_CTX_encrypting(c);
        if (arg <= 0 || arg > 8 || !enc || mctx->taglen < 0) {
            GOSTerr(GOST_F_GOST_MAGMA_MGM_CTRL,
                    GOST_R_INVALID_TAG_LENGTH);
            return 0;
        }
        memcpy(ptr, buf, arg);
        return 1;

    default:
        return -1;
    }
}